

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSpvAsmGraphicsShaderTestUtil.hpp
# Opt level: O2

string * vkt::SpirVAssembly::numberToString<float>(string *__return_storage_ptr__,float number)

{
  stringstream ss;
  stringstream local_190 [16];
  undefined1 local_180 [376];
  
  std::__cxx11::stringstream::stringstream(local_190);
  std::ostream::operator<<(local_180,number);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_190);
  return __return_storage_ptr__;
}

Assistant:

const std::string numberToString (T number)
{
	std::stringstream ss;
	ss << number;
	return ss.str();
}